

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O1

void updateNewNetworkNameManager
               (Abc_Ntk_t *pNtk,Aig_Man_t *pAig,Vec_Ptr_t *vPiNames,Vec_Ptr_t *vLoNames)

{
  Abc_Obj_t *pAVar1;
  long *plVar2;
  int iVar3;
  Nm_Man_t *pNVar4;
  ulong uVar5;
  char *pcVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  
  pNVar4 = Nm_ManCreate(pNtk->vCis->nSize);
  pNtk->pManName = pNVar4;
  if ((vPiNames != (Vec_Ptr_t *)0x0) && (0 < pAig->nTruePis)) {
    lVar8 = 0;
    do {
      if (((pAig->vCis->nSize <= lVar8) || (pNtk->vCis->nSize <= lVar8)) ||
         (vPiNames->nSize <= lVar8)) goto LAB_00623c59;
      Nm_ManStoreIdName(pNtk->pManName,*(int *)((long)pNtk->vCis->pArray[lVar8] + 0x10),
                        *(uint *)((long)pAig->vCis->pArray[lVar8] + 0x18) & 7,
                        (char *)vPiNames->pArray[lVar8],(char *)0x0);
      lVar8 = lVar8 + 1;
    } while (lVar8 < pAig->nTruePis);
  }
  if ((vLoNames != (Vec_Ptr_t *)0x0) && (0 < pAig->nRegs)) {
    lVar8 = 0;
    do {
      uVar5 = (ulong)(uint)pAig->nTruePis + lVar8;
      iVar3 = (int)uVar5;
      if (((iVar3 < 0) || (pAig->vCis->nSize <= iVar3)) ||
         ((pNtk->vCis->nSize <= iVar3 || (vLoNames->nSize <= lVar8)))) {
LAB_00623c59:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar5 = uVar5 & 0xffffffff;
      Nm_ManStoreIdName(pNtk->pManName,*(int *)((long)pNtk->vCis->pArray[uVar5] + 0x10),
                        *(uint *)((long)pAig->vCis->pArray[uVar5] + 0x18) & 7,
                        (char *)vLoNames->pArray[lVar8],(char *)0x0);
      lVar8 = lVar8 + 1;
    } while (lVar8 < pAig->nRegs);
  }
  pVVar7 = pNtk->vPos;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar7->pArray[lVar8];
      pcVar6 = Abc_ObjName(pAVar1);
      Abc_ObjAssignName(pAVar1,"assert_safety_",pcVar6);
      lVar8 = lVar8 + 1;
      pVVar7 = pNtk->vPos;
    } while (lVar8 < pVVar7->nSize);
  }
  pVVar7 = pNtk->vBoxes;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    do {
      plVar2 = (long *)pVVar7->pArray[lVar8];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        pcVar6 = Nm_ManFindNameById(pNtk->pManName,
                                    *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                      (long)*(int *)plVar2[4] * 8) + 0x10));
        if (pcVar6 == (char *)0x0) {
          pAVar1 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
          pcVar6 = Abc_ObjName(pAVar1);
          Abc_ObjAssignName(pAVar1,pcVar6,(char *)0x0);
        }
      }
      lVar8 = lVar8 + 1;
      pVVar7 = pNtk->vBoxes;
    } while (lVar8 < pVVar7->nSize);
  }
  return;
}

Assistant:

void updateNewNetworkNameManager( Abc_Ntk_t *pNtk, Aig_Man_t *pAig, Vec_Ptr_t *vPiNames, Vec_Ptr_t *vLoNames )
{
    Aig_Obj_t *pObj;
    Abc_Obj_t *pNode;
    int i, ntkObjId;

    pNtk->pManName = Nm_ManCreate( Abc_NtkCiNum( pNtk ) );

    if( vPiNames )
    {
        Saig_ManForEachPi( pAig, pObj, i )
        {
            ntkObjId = Abc_NtkCi( pNtk, i )->Id;
            //printf("Pi %d, Saved Name = %s, id = %d\n", i, Nm_ManStoreIdName( pNtk->pManName, ntkObjId, Aig_ObjType(pObj), Vec_PtrEntry(vPiNames, i), NULL ), ntkObjId);  
            Nm_ManStoreIdName( pNtk->pManName, ntkObjId, Aig_ObjType(pObj), (char *)Vec_PtrEntry(vPiNames, i), NULL );
        }
    }
    if( vLoNames )
    {
        Saig_ManForEachLo( pAig, pObj, i )
        {
            ntkObjId = Abc_NtkCi( pNtk, Saig_ManPiNum( pAig ) + i )->Id;
            //printf("Lo %d, Saved name = %s, id = %d\n", i, Nm_ManStoreIdName( pNtk->pManName, ntkObjId, Aig_ObjType(pObj), Vec_PtrEntry(vLoNames, i), NULL ), ntkObjId);  
            Nm_ManStoreIdName( pNtk->pManName, ntkObjId, Aig_ObjType(pObj), (char *)Vec_PtrEntry(vLoNames, i), NULL );
        }
    }

    Abc_NtkForEachPo(pNtk, pNode, i)
    {
        Abc_ObjAssignName(pNode, "assert_safety_", Abc_ObjName(pNode) );
    }

    // assign latch input names
    Abc_NtkForEachLatch(pNtk, pNode, i)
        if ( Nm_ManFindNameById(pNtk->pManName, Abc_ObjFanin0(pNode)->Id) == NULL )
            Abc_ObjAssignName( Abc_ObjFanin0(pNode), Abc_ObjName(Abc_ObjFanin0(pNode)), NULL );
}